

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_blockwise_nl_join.cpp
# Opt level: O0

void __thiscall
duckdb::BlockwiseNLJoinLocalScanState::~BlockwiseNLJoinLocalScanState
          (BlockwiseNLJoinLocalScanState *this)

{
  BlockwiseNLJoinLocalScanState *in_RDI;
  
  ~BlockwiseNLJoinLocalScanState(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

explicit BlockwiseNLJoinLocalScanState(const PhysicalBlockwiseNLJoin &op, BlockwiseNLJoinGlobalScanState &gstate) {
		D_ASSERT(op.sink_state);
		auto &sink = op.sink_state->Cast<BlockwiseNLJoinGlobalState>();
		sink.right_outer.InitializeScan(gstate.scan_state, scan_state);
	}